

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

int __thiscall Fl_Widget::damage_resize(Fl_Widget *this,int X,int Y,int W,int H)

{
  int iVar1;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Widget *this_local;
  
  iVar1 = x(this);
  if ((((iVar1 == X) && (iVar1 = y(this), iVar1 == Y)) && (iVar1 = w(this), iVar1 == W)) &&
     (iVar1 = h(this), iVar1 == H)) {
    return 0;
  }
  (*this->_vptr_Fl_Widget[4])(this,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H);
  redraw(this);
  return 1;
}

Assistant:

int Fl_Widget::damage_resize(int X, int Y, int W, int H) {
  if (x() == X && y() == Y && w() == W && h() == H) return 0;
  resize(X, Y, W, H);
  redraw();
  return 1;
}